

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modalgamepad.cpp
# Opt level: O1

NubClickMode parseNubClickMode(string *str)

{
  pointer pcVar1;
  _Alloc_hider _Var2;
  int iVar3;
  const_iterator cVar4;
  NubClickMode NVar5;
  size_type sVar6;
  string s;
  key_type local_40;
  
  pcVar1 = (str->_M_dataplus)._M_p;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + str->_M_string_length);
  _Var2._M_p = local_40._M_dataplus._M_p;
  if (local_40._M_string_length != 0) {
    sVar6 = 0;
    do {
      iVar3 = tolower((int)_Var2._M_p[sVar6]);
      _Var2._M_p[sVar6] = (char)iVar3;
      sVar6 = sVar6 + 1;
    } while (local_40._M_string_length != sVar6);
  }
  cVar4 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Settings::NubClickMode>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Settings::NubClickMode>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&NUB_CLICK_MODES_abi_cxx11_._M_h,&local_40);
  if (cVar4.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Settings::NubClickMode>,_true>
      ._M_cur == (__node_type *)0x0) {
    NVar5 = UNKNOWN_NUB_CLICK_MODE;
  }
  else {
    NVar5 = *(NubClickMode *)
             ((long)cVar4.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Settings::NubClickMode>,_true>
                    ._M_cur + 0x28);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return NVar5;
}

Assistant:

void destroy()
{
  global.stop = true;
  global.mouse->signal.notify_all();

  if(global.gamepad)
  {
    delete global.gamepad;
  }

  global.mouseThread.join();
}